

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

WaitStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::WaitStatement,slang::ast::Expression_const&,slang::ast::Statement_const&,slang::SourceRange>
          (BumpAllocator *this,Expression *args,Statement *args_1,SourceRange *args_2)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  WaitStatement *pWVar3;
  
  pWVar3 = (WaitStatement *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((WaitStatement *)this->endPtr < pWVar3 + 1) {
    pWVar3 = (WaitStatement *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pWVar3 + 1);
  }
  SVar1 = args_2->startLoc;
  SVar2 = args_2->endLoc;
  (pWVar3->super_Statement).kind = Wait;
  (pWVar3->super_Statement).syntax = (StatementSyntax *)0x0;
  (pWVar3->super_Statement).sourceRange.startLoc = SVar1;
  (pWVar3->super_Statement).sourceRange.endLoc = SVar2;
  pWVar3->cond = args;
  pWVar3->stmt = args_1;
  return pWVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }